

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncoderInit(VP8LEncoder *enc)

{
  int iVar1;
  int i;
  int refs_block_size;
  int pix_cnt;
  int height;
  int width;
  WebPPicture *pic;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  iVar1 = VP8LHashChainInit((VP8LHashChain *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
      VP8LBackwardRefsInit
                ((VP8LBackwardRefs *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int EncoderInit(VP8LEncoder* const enc) {
  const WebPPicture* const pic = enc->pic_;
  const int width = pic->width;
  const int height = pic->height;
  const int pix_cnt = width * height;
  // we round the block size up, so we're guaranteed to have
  // at most MAX_REFS_BLOCK_PER_IMAGE blocks used:
  const int refs_block_size = (pix_cnt - 1) / MAX_REFS_BLOCK_PER_IMAGE + 1;
  int i;
  if (!VP8LHashChainInit(&enc->hash_chain_, pix_cnt)) return 0;

  for (i = 0; i < 4; ++i) VP8LBackwardRefsInit(&enc->refs_[i], refs_block_size);

  return 1;
}